

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall Edge::GetBindingBool(Edge *this,string *key)

{
  string local_28;
  
  GetBinding(&local_28,this,key);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return local_28._M_string_length != 0;
}

Assistant:

bool Edge::GetBindingBool(const string& key) const {
  return !GetBinding(key).empty();
}